

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_layout_mapping_right_padding.cpp
# Opt level: O0

void test_2d_static<0ul,1ul,1ul,30ul>(void)

{
  ulong uVar1;
  value_type vVar2;
  value_type vVar3;
  size_type sVar4;
  bool bVar5;
  int local_1a4 [2];
  dimensions<0UL,_1UL> local_199;
  int local_198;
  dimensions<0UL,_1UL> local_191;
  int *local_190;
  int *local_188;
  size_type local_180;
  dimensions<0UL,_1UL> local_171;
  unsigned_long local_170;
  size_t true_idx_2;
  dimensions<0UL,_1UL> local_15d;
  int i_2;
  int local_158;
  int j_2;
  int local_150;
  dimensions<0UL,_1UL> local_149;
  int *local_148;
  int *local_140;
  size_type local_138;
  dimensions<0UL,_1UL> local_129;
  unsigned_long local_128;
  size_t true_idx_1;
  int local_118;
  dimensions<0UL,_1UL> local_111;
  int i_1;
  int local_10c;
  int j_1;
  int *local_100;
  size_type local_f8;
  dimensions<0UL,_1UL> local_e9;
  unsigned_long local_e8;
  size_t true_idx;
  int i;
  int j;
  int dptr [31];
  unsigned_long local_50;
  size_type local_48;
  unsigned_long local_40;
  size_type local_38;
  int local_2c;
  size_type local_28;
  int local_1c;
  size_type local_18;
  bool local_d;
  bool local_c;
  layout_mapping_right<std::experimental::dimensions<1UL,_30UL>,_std::experimental::dimensions<1UL,_1UL>,_std::experimental::dimensions<0UL,_1UL>_>
  local_b [2];
  layout_mapping_right<std::experimental::dimensions<1UL,_30UL>,_std::experimental::dimensions<1UL,_1UL>,_std::experimental::dimensions<0UL,_1UL>_>
  l;
  
  std::experimental::
  layout_mapping_right<std::experimental::dimensions<1UL,_30UL>,_std::experimental::dimensions<1UL,_1UL>,_std::experimental::dimensions<0UL,_1UL>_>
  ::layout_mapping_right(local_b);
  local_c = std::experimental::
            layout_mapping_right<std::experimental::dimensions<1UL,_30UL>,_std::experimental::dimensions<1UL,_1UL>,_std::experimental::dimensions<0UL,_1UL>_>
            ::is_regular();
  local_d = true;
  boost::detail::test_eq_impl<bool,bool>
            ("(l.is_regular())","true",
             "/workspace/llm4binary/github/license_all_cmakelists_25/brycelelbach[P]mdspan/tests/test_layout_mapping_right_padding.cpp"
             ,0x1d,"void test_2d_static() [N = 0UL, M = 1UL, X = 1UL, Y = 30UL]",&local_c,&local_d);
  local_18 = std::experimental::
             layout_mapping_right<std::experimental::dimensions<1UL,_30UL>,_std::experimental::dimensions<1UL,_1UL>,_std::experimental::dimensions<0UL,_1UL>_>
             ::stride(local_b,0);
  local_1c = 1;
  boost::detail::test_eq_impl<unsigned_long,int>
            ("(l.stride(0))","1",
             "/workspace/llm4binary/github/license_all_cmakelists_25/brycelelbach[P]mdspan/tests/test_layout_mapping_right_padding.cpp"
             ,0x1f,"void test_2d_static() [N = 0UL, M = 1UL, X = 1UL, Y = 30UL]",&local_18,&local_1c
            );
  local_28 = std::experimental::
             layout_mapping_right<std::experimental::dimensions<1UL,_30UL>,_std::experimental::dimensions<1UL,_1UL>,_std::experimental::dimensions<0UL,_1UL>_>
             ::stride(local_b,1);
  local_2c = 1;
  boost::detail::test_eq_impl<unsigned_long,int>
            ("(l.stride(1))","1",
             "/workspace/llm4binary/github/license_all_cmakelists_25/brycelelbach[P]mdspan/tests/test_layout_mapping_right_padding.cpp"
             ,0x20,"void test_2d_static() [N = 0UL, M = 1UL, X = 1UL, Y = 30UL]",&local_28,&local_2c
            );
  local_38 = std::experimental::dimensions<1UL,_30UL>::size((dimensions<1UL,_30UL> *)local_b);
  local_40 = 0x1e;
  boost::detail::test_eq_impl<unsigned_long,unsigned_long>
            ("(l.size())","X * Y",
             "/workspace/llm4binary/github/license_all_cmakelists_25/brycelelbach[P]mdspan/tests/test_layout_mapping_right_padding.cpp"
             ,0x22,"void test_2d_static() [N = 0UL, M = 1UL, X = 1UL, Y = 30UL]",&local_38,&local_40
            );
  local_48 = std::experimental::
             layout_mapping_right<std::experimental::dimensions<1UL,_30UL>,_std::experimental::dimensions<1UL,_1UL>,_std::experimental::dimensions<0UL,_1UL>_>
             ::span(local_b);
  local_50 = 0x1f;
  boost::detail::test_eq_impl<unsigned_long,unsigned_long>
            ("(l.span())","(X + N) * (Y + M)",
             "/workspace/llm4binary/github/license_all_cmakelists_25/brycelelbach[P]mdspan/tests/test_layout_mapping_right_padding.cpp"
             ,0x23,"void test_2d_static() [N = 0UL, M = 1UL, X = 1UL, Y = 30UL]",&local_48,&local_50
            );
  for (true_idx._4_4_ = 0; uVar1 = (ulong)true_idx._4_4_,
      vVar2 = std::experimental::dimensions<1UL,_30UL>::operator[]<int>
                        ((dimensions<1UL,_30UL> *)local_b,1), uVar1 < vVar2;
      true_idx._4_4_ = true_idx._4_4_ + 1) {
    for (true_idx._0_4_ = 0; uVar1 = (ulong)(int)true_idx,
        vVar2 = std::experimental::dimensions<1UL,_30UL>::operator[]<int>
                          ((dimensions<1UL,_30UL> *)local_b,0), uVar1 < vVar2;
        true_idx._0_4_ = (int)true_idx + 1) {
      vVar2 = std::experimental::dimensions<1UL,_30UL>::operator[]<int>
                        ((dimensions<1UL,_30UL> *)local_b,1);
      std::experimental::
      layout_mapping_right<std::experimental::dimensions<1UL,_30UL>,_std::experimental::dimensions<1UL,_1UL>,_std::experimental::dimensions<0UL,_1UL>_>
      ::padding(local_b);
      vVar3 = std::experimental::dimensions<0UL,_1UL>::operator[]<int>(&local_e9,1);
      local_e8 = (vVar2 + vVar3) * (long)(int)true_idx + (long)true_idx._4_4_;
      local_f8 = std::experimental::
                 layout_mapping_right<std::experimental::dimensions<1ul,30ul>,std::experimental::dimensions<1ul,1ul>,std::experimental::dimensions<0ul,1ul>>
                 ::index<int,int>((layout_mapping_right<std::experimental::dimensions<1ul,30ul>,std::experimental::dimensions<1ul,1ul>,std::experimental::dimensions<0ul,1ul>>
                                   *)local_b,(int)true_idx,true_idx._4_4_);
      boost::detail::test_eq_impl<unsigned_long,unsigned_long>
                ("(l.index(i, j))","true_idx",
                 "/workspace/llm4binary/github/license_all_cmakelists_25/brycelelbach[P]mdspan/tests/test_layout_mapping_right_padding.cpp"
                 ,0x2d,"void test_2d_static() [N = 0UL, M = 1UL, X = 1UL, Y = 30UL]",&local_f8,
                 &local_e8);
      sVar4 = std::experimental::
              layout_mapping_right<std::experimental::dimensions<1ul,30ul>,std::experimental::dimensions<1ul,1ul>,std::experimental::dimensions<0ul,1ul>>
              ::index<int,int>((layout_mapping_right<std::experimental::dimensions<1ul,30ul>,std::experimental::dimensions<1ul,1ul>,std::experimental::dimensions<0ul,1ul>>
                                *)local_b,(int)true_idx,true_idx._4_4_);
      local_100 = &i + sVar4;
      _j_1 = &i + local_e8;
      boost::detail::test_eq_impl<int*,int*>
                ("&(dptr[l.index(i, j)])","&(dptr[true_idx])",
                 "/workspace/llm4binary/github/license_all_cmakelists_25/brycelelbach[P]mdspan/tests/test_layout_mapping_right_padding.cpp"
                 ,0x2f,"void test_2d_static() [N = 0UL, M = 1UL, X = 1UL, Y = 30UL]",&local_100,
                 (int **)&j_1);
      sVar4 = std::experimental::
              layout_mapping_right<std::experimental::dimensions<1ul,30ul>,std::experimental::dimensions<1ul,1ul>,std::experimental::dimensions<0ul,1ul>>
              ::index<int,int>((layout_mapping_right<std::experimental::dimensions<1ul,30ul>,std::experimental::dimensions<1ul,1ul>,std::experimental::dimensions<0ul,1ul>>
                                *)local_b,(int)true_idx,true_idx._4_4_);
      (&i)[sVar4] = 0x2a;
      sVar4 = std::experimental::
              layout_mapping_right<std::experimental::dimensions<1ul,30ul>,std::experimental::dimensions<1ul,1ul>,std::experimental::dimensions<0ul,1ul>>
              ::index<int,int>((layout_mapping_right<std::experimental::dimensions<1ul,30ul>,std::experimental::dimensions<1ul,1ul>,std::experimental::dimensions<0ul,1ul>>
                                *)local_b,(int)true_idx,true_idx._4_4_);
      local_10c = 0x2a;
      boost::detail::test_eq_impl<int,int>
                ("(dptr[l.index(i, j)])","42",
                 "/workspace/llm4binary/github/license_all_cmakelists_25/brycelelbach[P]mdspan/tests/test_layout_mapping_right_padding.cpp"
                 ,0x33,"void test_2d_static() [N = 0UL, M = 1UL, X = 1UL, Y = 30UL]",&i + sVar4,
                 &local_10c);
    }
  }
  i_1 = 0;
  while( true ) {
    uVar1 = (ulong)i_1;
    vVar2 = std::experimental::dimensions<1UL,_30UL>::operator[]<int>
                      ((dimensions<1UL,_30UL> *)local_b,1);
    std::experimental::
    layout_mapping_right<std::experimental::dimensions<1UL,_30UL>,_std::experimental::dimensions<1UL,_1UL>,_std::experimental::dimensions<0UL,_1UL>_>
    ::padding(local_b);
    vVar3 = std::experimental::dimensions<0UL,_1UL>::operator[]<int>(&local_111,1);
    if (vVar2 + vVar3 <= uVar1) break;
    local_118 = 0;
    while( true ) {
      uVar1 = (ulong)local_118;
      vVar2 = std::experimental::dimensions<1UL,_30UL>::operator[]<int>
                        ((dimensions<1UL,_30UL> *)local_b,0);
      std::experimental::
      layout_mapping_right<std::experimental::dimensions<1UL,_30UL>,_std::experimental::dimensions<1UL,_1UL>,_std::experimental::dimensions<0UL,_1UL>_>
      ::padding(local_b);
      vVar3 = std::experimental::dimensions<0UL,_1UL>::operator[]<int>
                        ((dimensions<0UL,_1UL> *)((long)&true_idx_1 + 7),0);
      if (vVar2 + vVar3 <= uVar1) break;
      vVar2 = std::experimental::dimensions<1UL,_30UL>::operator[]<int>
                        ((dimensions<1UL,_30UL> *)local_b,1);
      std::experimental::
      layout_mapping_right<std::experimental::dimensions<1UL,_30UL>,_std::experimental::dimensions<1UL,_1UL>,_std::experimental::dimensions<0UL,_1UL>_>
      ::padding(local_b);
      vVar3 = std::experimental::dimensions<0UL,_1UL>::operator[]<int>(&local_129,1);
      local_128 = (vVar2 + vVar3) * (long)local_118 + (long)i_1;
      local_138 = std::experimental::
                  layout_mapping_right<std::experimental::dimensions<1ul,30ul>,std::experimental::dimensions<1ul,1ul>,std::experimental::dimensions<0ul,1ul>>
                  ::index<int,int>((layout_mapping_right<std::experimental::dimensions<1ul,30ul>,std::experimental::dimensions<1ul,1ul>,std::experimental::dimensions<0ul,1ul>>
                                    *)local_b,local_118,i_1);
      boost::detail::test_eq_impl<unsigned_long,unsigned_long>
                ("(l.index(i, j))","true_idx",
                 "/workspace/llm4binary/github/license_all_cmakelists_25/brycelelbach[P]mdspan/tests/test_layout_mapping_right_padding.cpp"
                 ,0x3c,"void test_2d_static() [N = 0UL, M = 1UL, X = 1UL, Y = 30UL]",&local_138,
                 &local_128);
      sVar4 = std::experimental::
              layout_mapping_right<std::experimental::dimensions<1ul,30ul>,std::experimental::dimensions<1ul,1ul>,std::experimental::dimensions<0ul,1ul>>
              ::index<int,int>((layout_mapping_right<std::experimental::dimensions<1ul,30ul>,std::experimental::dimensions<1ul,1ul>,std::experimental::dimensions<0ul,1ul>>
                                *)local_b,local_118,i_1);
      local_140 = &i + sVar4;
      local_148 = &i + local_128;
      boost::detail::test_eq_impl<int*,int*>
                ("&(dptr[l.index(i, j)])","&(dptr[true_idx])",
                 "/workspace/llm4binary/github/license_all_cmakelists_25/brycelelbach[P]mdspan/tests/test_layout_mapping_right_padding.cpp"
                 ,0x3e,"void test_2d_static() [N = 0UL, M = 1UL, X = 1UL, Y = 30UL]",&local_140,
                 &local_148);
      vVar2 = std::experimental::dimensions<1UL,_30UL>::operator[]<int>
                        ((dimensions<1UL,_30UL> *)local_b,0);
      bVar5 = false;
      if (vVar2 <= (ulong)(long)local_118) {
        uVar1 = (ulong)local_118;
        vVar2 = std::experimental::dimensions<1UL,_30UL>::operator[]<int>
                          ((dimensions<1UL,_30UL> *)local_b,0);
        std::experimental::
        layout_mapping_right<std::experimental::dimensions<1UL,_30UL>,_std::experimental::dimensions<1UL,_1UL>,_std::experimental::dimensions<0UL,_1UL>_>
        ::padding(local_b);
        vVar3 = std::experimental::dimensions<0UL,_1UL>::operator[]<int>(&local_149,0);
        bVar5 = uVar1 < vVar2 + vVar3;
      }
      if (bVar5) {
        sVar4 = std::experimental::
                layout_mapping_right<std::experimental::dimensions<1ul,30ul>,std::experimental::dimensions<1ul,1ul>,std::experimental::dimensions<0ul,1ul>>
                ::index<int,int>((layout_mapping_right<std::experimental::dimensions<1ul,30ul>,std::experimental::dimensions<1ul,1ul>,std::experimental::dimensions<0ul,1ul>>
                                  *)local_b,local_118,i_1);
        (&i)[sVar4] = 0x11;
        sVar4 = std::experimental::
                layout_mapping_right<std::experimental::dimensions<1ul,30ul>,std::experimental::dimensions<1ul,1ul>,std::experimental::dimensions<0ul,1ul>>
                ::index<int,int>((layout_mapping_right<std::experimental::dimensions<1ul,30ul>,std::experimental::dimensions<1ul,1ul>,std::experimental::dimensions<0ul,1ul>>
                                  *)local_b,local_118,i_1);
        local_150 = 0x11;
        boost::detail::test_eq_impl<int,int>
                  ("(dptr[l.index(i, j)])","17",
                   "/workspace/llm4binary/github/license_all_cmakelists_25/brycelelbach[P]mdspan/tests/test_layout_mapping_right_padding.cpp"
                   ,0x45,"void test_2d_static() [N = 0UL, M = 1UL, X = 1UL, Y = 30UL]",&i + sVar4,
                   &local_150);
      }
      else {
        vVar2 = std::experimental::dimensions<1UL,_30UL>::operator[]<int>
                          ((dimensions<1UL,_30UL> *)local_b,1);
        bVar5 = false;
        if (vVar2 <= (ulong)(long)i_1) {
          uVar1 = (ulong)i_1;
          vVar2 = std::experimental::dimensions<1UL,_30UL>::operator[]<int>
                            ((dimensions<1UL,_30UL> *)local_b,1);
          std::experimental::
          layout_mapping_right<std::experimental::dimensions<1UL,_30UL>,_std::experimental::dimensions<1UL,_1UL>,_std::experimental::dimensions<0UL,_1UL>_>
          ::padding(local_b);
          vVar3 = std::experimental::dimensions<0UL,_1UL>::operator[]<int>
                            ((dimensions<0UL,_1UL> *)((long)&j_2 + 3),1);
          bVar5 = uVar1 < vVar2 + vVar3;
        }
        if (bVar5) {
          sVar4 = std::experimental::
                  layout_mapping_right<std::experimental::dimensions<1ul,30ul>,std::experimental::dimensions<1ul,1ul>,std::experimental::dimensions<0ul,1ul>>
                  ::index<int,int>((layout_mapping_right<std::experimental::dimensions<1ul,30ul>,std::experimental::dimensions<1ul,1ul>,std::experimental::dimensions<0ul,1ul>>
                                    *)local_b,local_118,i_1);
          (&i)[sVar4] = 0x18;
          sVar4 = std::experimental::
                  layout_mapping_right<std::experimental::dimensions<1ul,30ul>,std::experimental::dimensions<1ul,1ul>,std::experimental::dimensions<0ul,1ul>>
                  ::index<int,int>((layout_mapping_right<std::experimental::dimensions<1ul,30ul>,std::experimental::dimensions<1ul,1ul>,std::experimental::dimensions<0ul,1ul>>
                                    *)local_b,local_118,i_1);
          local_158 = 0x18;
          boost::detail::test_eq_impl<int,int>
                    ("(dptr[l.index(i, j)])","24",
                     "/workspace/llm4binary/github/license_all_cmakelists_25/brycelelbach[P]mdspan/tests/test_layout_mapping_right_padding.cpp"
                     ,0x4d,"void test_2d_static() [N = 0UL, M = 1UL, X = 1UL, Y = 30UL]",&i + sVar4,
                     &local_158);
        }
      }
      local_118 = local_118 + 1;
    }
    i_1 = i_1 + 1;
  }
  i_2 = 0;
  while( true ) {
    uVar1 = (ulong)i_2;
    vVar2 = std::experimental::dimensions<1UL,_30UL>::operator[]<int>
                      ((dimensions<1UL,_30UL> *)local_b,1);
    std::experimental::
    layout_mapping_right<std::experimental::dimensions<1UL,_30UL>,_std::experimental::dimensions<1UL,_1UL>,_std::experimental::dimensions<0UL,_1UL>_>
    ::padding(local_b);
    vVar3 = std::experimental::dimensions<0UL,_1UL>::operator[]<int>(&local_15d,1);
    if (vVar2 + vVar3 <= uVar1) break;
    true_idx_2._4_4_ = 0;
    while( true ) {
      uVar1 = (ulong)true_idx_2._4_4_;
      vVar2 = std::experimental::dimensions<1UL,_30UL>::operator[]<int>
                        ((dimensions<1UL,_30UL> *)local_b,0);
      std::experimental::
      layout_mapping_right<std::experimental::dimensions<1UL,_30UL>,_std::experimental::dimensions<1UL,_1UL>,_std::experimental::dimensions<0UL,_1UL>_>
      ::padding(local_b);
      vVar3 = std::experimental::dimensions<0UL,_1UL>::operator[]<int>
                        ((dimensions<0UL,_1UL> *)((long)&true_idx_2 + 3),0);
      if (vVar2 + vVar3 <= uVar1) break;
      vVar2 = std::experimental::dimensions<1UL,_30UL>::operator[]<int>
                        ((dimensions<1UL,_30UL> *)local_b,1);
      std::experimental::
      layout_mapping_right<std::experimental::dimensions<1UL,_30UL>,_std::experimental::dimensions<1UL,_1UL>,_std::experimental::dimensions<0UL,_1UL>_>
      ::padding(local_b);
      vVar3 = std::experimental::dimensions<0UL,_1UL>::operator[]<int>(&local_171,1);
      local_170 = (vVar2 + vVar3) * (long)true_idx_2._4_4_ + (long)i_2;
      local_180 = std::experimental::
                  layout_mapping_right<std::experimental::dimensions<1ul,30ul>,std::experimental::dimensions<1ul,1ul>,std::experimental::dimensions<0ul,1ul>>
                  ::index<int,int>((layout_mapping_right<std::experimental::dimensions<1ul,30ul>,std::experimental::dimensions<1ul,1ul>,std::experimental::dimensions<0ul,1ul>>
                                    *)local_b,true_idx_2._4_4_,i_2);
      boost::detail::test_eq_impl<unsigned_long,unsigned_long>
                ("(l.index(i, j))","true_idx",
                 "/workspace/llm4binary/github/license_all_cmakelists_25/brycelelbach[P]mdspan/tests/test_layout_mapping_right_padding.cpp"
                 ,0x57,"void test_2d_static() [N = 0UL, M = 1UL, X = 1UL, Y = 30UL]",&local_180,
                 &local_170);
      sVar4 = std::experimental::
              layout_mapping_right<std::experimental::dimensions<1ul,30ul>,std::experimental::dimensions<1ul,1ul>,std::experimental::dimensions<0ul,1ul>>
              ::index<int,int>((layout_mapping_right<std::experimental::dimensions<1ul,30ul>,std::experimental::dimensions<1ul,1ul>,std::experimental::dimensions<0ul,1ul>>
                                *)local_b,true_idx_2._4_4_,i_2);
      local_188 = &i + sVar4;
      local_190 = &i + local_170;
      boost::detail::test_eq_impl<int*,int*>
                ("&(dptr[l.index(i, j)])","&(dptr[true_idx])",
                 "/workspace/llm4binary/github/license_all_cmakelists_25/brycelelbach[P]mdspan/tests/test_layout_mapping_right_padding.cpp"
                 ,0x59,"void test_2d_static() [N = 0UL, M = 1UL, X = 1UL, Y = 30UL]",&local_188,
                 &local_190);
      vVar2 = std::experimental::dimensions<1UL,_30UL>::operator[]<int>
                        ((dimensions<1UL,_30UL> *)local_b,0);
      bVar5 = false;
      if (vVar2 <= (ulong)(long)true_idx_2._4_4_) {
        uVar1 = (ulong)true_idx_2._4_4_;
        vVar2 = std::experimental::dimensions<1UL,_30UL>::operator[]<int>
                          ((dimensions<1UL,_30UL> *)local_b,0);
        std::experimental::
        layout_mapping_right<std::experimental::dimensions<1UL,_30UL>,_std::experimental::dimensions<1UL,_1UL>,_std::experimental::dimensions<0UL,_1UL>_>
        ::padding(local_b);
        vVar3 = std::experimental::dimensions<0UL,_1UL>::operator[]<int>(&local_191,0);
        bVar5 = uVar1 < vVar2 + vVar3;
      }
      if (bVar5) {
        sVar4 = std::experimental::
                layout_mapping_right<std::experimental::dimensions<1ul,30ul>,std::experimental::dimensions<1ul,1ul>,std::experimental::dimensions<0ul,1ul>>
                ::index<int,int>((layout_mapping_right<std::experimental::dimensions<1ul,30ul>,std::experimental::dimensions<1ul,1ul>,std::experimental::dimensions<0ul,1ul>>
                                  *)local_b,true_idx_2._4_4_,i_2);
        local_198 = 0x11;
        boost::detail::test_eq_impl<int,int>
                  ("(dptr[l.index(i, j)])","17",
                   "/workspace/llm4binary/github/license_all_cmakelists_25/brycelelbach[P]mdspan/tests/test_layout_mapping_right_padding.cpp"
                   ,0x5e,"void test_2d_static() [N = 0UL, M = 1UL, X = 1UL, Y = 30UL]",&i + sVar4,
                   &local_198);
      }
      else {
        vVar2 = std::experimental::dimensions<1UL,_30UL>::operator[]<int>
                          ((dimensions<1UL,_30UL> *)local_b,1);
        bVar5 = false;
        if (vVar2 <= (ulong)(long)i_2) {
          uVar1 = (ulong)i_2;
          vVar2 = std::experimental::dimensions<1UL,_30UL>::operator[]<int>
                            ((dimensions<1UL,_30UL> *)local_b,1);
          std::experimental::
          layout_mapping_right<std::experimental::dimensions<1UL,_30UL>,_std::experimental::dimensions<1UL,_1UL>,_std::experimental::dimensions<0UL,_1UL>_>
          ::padding(local_b);
          vVar3 = std::experimental::dimensions<0UL,_1UL>::operator[]<int>(&local_199,1);
          bVar5 = uVar1 < vVar2 + vVar3;
        }
        if (bVar5) {
          sVar4 = std::experimental::
                  layout_mapping_right<std::experimental::dimensions<1ul,30ul>,std::experimental::dimensions<1ul,1ul>,std::experimental::dimensions<0ul,1ul>>
                  ::index<int,int>((layout_mapping_right<std::experimental::dimensions<1ul,30ul>,std::experimental::dimensions<1ul,1ul>,std::experimental::dimensions<0ul,1ul>>
                                    *)local_b,true_idx_2._4_4_,i_2);
          local_1a4[1] = 0x18;
          boost::detail::test_eq_impl<int,int>
                    ("(dptr[l.index(i, j)])","24",
                     "/workspace/llm4binary/github/license_all_cmakelists_25/brycelelbach[P]mdspan/tests/test_layout_mapping_right_padding.cpp"
                     ,100,"void test_2d_static() [N = 0UL, M = 1UL, X = 1UL, Y = 30UL]",&i + sVar4,
                     local_1a4 + 1);
        }
        else {
          sVar4 = std::experimental::
                  layout_mapping_right<std::experimental::dimensions<1ul,30ul>,std::experimental::dimensions<1ul,1ul>,std::experimental::dimensions<0ul,1ul>>
                  ::index<int,int>((layout_mapping_right<std::experimental::dimensions<1ul,30ul>,std::experimental::dimensions<1ul,1ul>,std::experimental::dimensions<0ul,1ul>>
                                    *)local_b,true_idx_2._4_4_,i_2);
          local_1a4[0] = 0x2a;
          boost::detail::test_eq_impl<int,int>
                    ("(dptr[l.index(i, j)])","42",
                     "/workspace/llm4binary/github/license_all_cmakelists_25/brycelelbach[P]mdspan/tests/test_layout_mapping_right_padding.cpp"
                     ,0x6a,"void test_2d_static() [N = 0UL, M = 1UL, X = 1UL, Y = 30UL]",&i + sVar4,
                     local_1a4);
        }
      }
      true_idx_2._4_4_ = true_idx_2._4_4_ + 1;
    }
    i_2 = i_2 + 1;
  }
  return;
}

Assistant:

void test_2d_static()
{ // {{{
    layout_mapping_right<
        dimensions<X, Y>, dimensions<1, 1>, dimensions<N, M>
    > const l{};

    BOOST_TEST_EQ((l.is_regular()), true);

    BOOST_TEST_EQ((l.stride(0)), 1);
    BOOST_TEST_EQ((l.stride(1)), 1);

    BOOST_TEST_EQ((l.size()), X * Y);
    BOOST_TEST_EQ((l.span()), (X + N) * (Y + M));

    int dptr[(X + N) * (Y + M)];

    // Set all real elements to 42.
    for (auto j = 0; j < l[1]; ++j)
    for (auto i = 0; i < l[0]; ++i)
    {
        auto const true_idx = (l[1] + l.padding()[1]) * (i) + (j);

        BOOST_TEST_EQ((l.index(i, j)), true_idx);

        BOOST_TEST_EQ(&(dptr[l.index(i, j)]), &(dptr[true_idx]));

        dptr[l.index(i, j)] = 42;

        BOOST_TEST_EQ((dptr[l.index(i, j)]), 42);
    }

    // Set X pad elements to 17 and Y pad elements to 24. 
    for (auto j = 0; j < l[1] + l.padding()[1]; ++j)
    for (auto i = 0; i < l[0] + l.padding()[0]; ++i)
    {
        auto const true_idx = (l[1] + l.padding()[1]) * (i) + (j);

        BOOST_TEST_EQ((l.index(i, j)), true_idx);

        BOOST_TEST_EQ(&(dptr[l.index(i, j)]), &(dptr[true_idx])); 

        // X-pad element.
        if      ((l[0] <= i) && (i < (l[0] + l.padding()[0])))
        {
            dptr[l.index(i, j)] = 17;
            
            BOOST_TEST_EQ((dptr[l.index(i, j)]), 17);
        }

        // Y-pad element.
        else if ((l[1] <= j) && (j < (l[1] + l.padding()[1])))
        {
            dptr[l.index(i, j)] = 24;

            BOOST_TEST_EQ((dptr[l.index(i, j)]), 24);
        }
    }

    // Check final structure. 
    for (auto j = 0; j < l[1] + l.padding()[1]; ++j)
    for (auto i = 0; i < l[0] + l.padding()[0]; ++i)
    {
        auto const true_idx = (l[1] + l.padding()[1]) * (i) + (j);

        BOOST_TEST_EQ((l.index(i, j)), true_idx);

        BOOST_TEST_EQ(&(dptr[l.index(i, j)]), &(dptr[true_idx])); 

        // X-pad element.
        if      ((l[0] <= i) && (i < (l[0] + l.padding()[0])))
        {
            BOOST_TEST_EQ((dptr[l.index(i, j)]), 17);
        }

        // Y-pad element.
        else if ((l[1] <= j) && (j < (l[1] + l.padding()[1])))
        {
            BOOST_TEST_EQ((dptr[l.index(i, j)]), 24);
        }

        // Real element.
        else
        {
            BOOST_TEST_EQ((dptr[l.index(i, j)]), 42);
        }
    }
}